

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_srtp_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  SSL *ssl;
  int iVar1;
  bool bVar2;
  CBB contents;
  CBB profile_ids;
  CBB CStack_78;
  CBB local_48;
  
  ssl = hs->ssl;
  if (ssl->s3->srtp_profile == (SRTP_PROTECTION_PROFILE *)0x0) {
    bVar2 = true;
  }
  else {
    iVar1 = SSL_is_dtls(ssl);
    if (iVar1 == 0) {
      __assert_fail("SSL_is_dtls(ssl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x6e6,"bool bssl::ext_srtp_add_serverhello(SSL_HANDSHAKE *, CBB *)");
    }
    iVar1 = CBB_add_u16(out,0xe);
    if ((((iVar1 != 0) && (iVar1 = CBB_add_u16_length_prefixed(out,&CStack_78), iVar1 != 0)) &&
        (iVar1 = CBB_add_u16_length_prefixed(&CStack_78,&local_48), iVar1 != 0)) &&
       (iVar1 = CBB_add_u16(&local_48,(uint16_t)ssl->s3->srtp_profile->id), iVar1 != 0)) {
      iVar1 = CBB_add_u8(&CStack_78,'\0');
      if (iVar1 == 0) {
        return false;
      }
      iVar1 = CBB_flush(out);
      return iVar1 != 0;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool ext_srtp_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  if (ssl->s3->srtp_profile == NULL) {
    return true;
  }

  assert(SSL_is_dtls(ssl));
  CBB contents, profile_ids;
  if (!CBB_add_u16(out, TLSEXT_TYPE_srtp) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &profile_ids) ||
      !CBB_add_u16(&profile_ids, ssl->s3->srtp_profile->id) ||
      !CBB_add_u8(&contents, 0 /* empty MKI */) || !CBB_flush(out)) {
    return false;
  }

  return true;
}